

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QMap<QString,QVariant>>::emplace<QMap<QString,QVariant>>
          (QMovableArrayOps<QMap<QString,QVariant>> *this,qsizetype i,QMap<QString,_QVariant> *args)

{
  long lVar1;
  long lVar2;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar3;
  qsizetype qVar4;
  totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
  __old_val;
  long in_FS_OFFSET;
  Inserter local_60;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar4 = QArrayDataPointer<QMap<QString,_QVariant>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<QMap<QString,_QVariant>_> *)this);
      if (qVar4 == 0) goto LAB_00130c0b;
      lVar1 = *(long *)(this + 8);
      lVar2 = *(long *)(this + 0x10);
      pQVar3 = (args->d).d.ptr;
      (args->d).d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)0x0;
      *(QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
        **)(lVar1 + lVar2 * 8) = pQVar3;
LAB_00130cde:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_00130c9c;
    }
LAB_00130c0b:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QMap<QString,_QVariant>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<QMap<QString,_QVariant>_> *)this);
      if (qVar4 != 0) {
        lVar1 = *(long *)(this + 8);
        pQVar3 = (args->d).d.ptr;
        (args->d).d.ptr =
             (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
              *)0x0;
        *(QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
          **)(lVar1 + -8) = pQVar3;
        *(long *)(this + 8) = *(long *)(this + 8) + -8;
        goto LAB_00130cde;
      }
    }
  }
  pQVar3 = (args->d).d.ptr;
  (args->d).d.ptr =
       (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
        *)0x0;
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<QMap<QString,_QVariant>_>::detachAndGrow
            ((QArrayDataPointer<QMap<QString,_QVariant>_> *)this,(uint)(i == 0 && lVar1 != 0),1,
             (QMap<QString,_QVariant> **)0x0,(QArrayDataPointer<QMap<QString,_QVariant>_> *)0x0);
  if (i == 0 && lVar1 != 0) {
    *(QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
      **)(*(long *)(this + 8) + -8) = pQVar3;
    *(long *)(this + 8) = *(long *)(this + 8) + -8;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<QMap<QString,_QVariant>_>::Inserter::Inserter
              (&local_60,(QArrayDataPointer<QMap<QString,_QVariant>_> *)this,i,1);
    ((local_60.displaceFrom)->d).d.ptr = pQVar3;
    local_60.displaceFrom = local_60.displaceFrom + 1;
    (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
  }
  local_38.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
        )(QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
          *)0x0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_38);
LAB_00130c9c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }